

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O3

void DumpClassMap(FClassMap *themap)

{
  uint uVar1;
  Node *pNVar2;
  uint *puVar3;
  Node *pNVar4;
  hash_t hVar5;
  void *__base;
  uint uVar6;
  ulong uVar7;
  IPair *pIVar8;
  ulong uVar9;
  
  hVar5 = TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_>::CountUsed
                    (themap);
  __base = operator_new__((ulong)hVar5 << 3);
  uVar1 = themap->Size;
  if ((ulong)uVar1 == 0) {
    qsort(__base,0,8,SpawnableSort);
  }
  else {
    pNVar2 = themap->Nodes;
    uVar9 = 0;
    uVar6 = 0;
    do {
      uVar7 = (ulong)uVar6;
      pNVar4 = pNVar2 + uVar7;
      while (pIVar8 = &pNVar4->Pair, *(long *)((long)(pIVar8 + -1) + 8) == 1) {
        uVar7 = uVar7 + 1;
        pNVar4 = (Node *)(pIVar8 + 1);
        if (uVar1 <= uVar7) {
          uVar7 = uVar9 & 0xffffffff;
          qsort(__base,uVar7,8,SpawnableSort);
          if (uVar9 == 0) goto LAB_0045b989;
          goto LAB_0045b930;
        }
      }
      uVar6 = (int)uVar7 + 1;
      *(IPair **)((long)__base + uVar9 * 8) = pIVar8;
      uVar9 = uVar9 + 1;
    } while (uVar6 < uVar1);
    uVar7 = uVar9 & 0xffffffff;
    qsort(__base,uVar7,8,SpawnableSort);
LAB_0045b930:
    uVar9 = 0;
    do {
      puVar3 = *(uint **)((long)__base + uVar9 * 8);
      Printf("%d %s\n",(ulong)*puVar3,
             FName::NameData.NameArray[*(int *)(*(long *)(puVar3 + 2) + 0xa0)].Text);
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
  }
LAB_0045b989:
  operator_delete__(__base);
  return;
}

Assistant:

static void DumpClassMap(FClassMap &themap)
{
	FClassMap::Iterator it(themap);
	FClassMap::Pair *pair, **allpairs;
	int i = 0;

	// Sort into numerical order, since their arrangement in the map can
	// be in an unspecified order.
	allpairs = new FClassMap::Pair *[themap.CountUsed()];
	while (it.NextPair(pair))
	{
		allpairs[i++] = pair;
	}
	qsort(allpairs, i, sizeof(*allpairs), SpawnableSort);
	for (int j = 0; j < i; ++j)
	{
		pair = allpairs[j];
		Printf ("%d %s\n", pair->Key, pair->Value->TypeName.GetChars());
	}
	delete[] allpairs;
}